

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryGridRenderTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::tessellation::anon_unknown_1::GridRenderTestInstance::iterate
          (TestStatus *__return_storage_ptr__,GridRenderTestInstance *this)

{
  deUint32 numArrayLayers;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var1;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  GridRenderTestInstance *pGVar2;
  VkDeviceSize bufferSizeBytes;
  Allocation *pAVar3;
  int iVar4;
  int iVar5;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *allocator;
  TextureFormat TVar6;
  const_iterator cVar7;
  GraphicsPipelineBuilder *pGVar8;
  TestLog *pTVar9;
  ConstPixelBufferAccess *access;
  ConstPixelBufferAccess *pCVar10;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  TestStatus *pTVar11;
  void *pvVar12;
  bool bVar13;
  int iVar14;
  VkCommandBuffer commandBuffer;
  int y;
  void **ppvVar15;
  int z;
  VkImageSubresourceLayers subresourceLayers;
  VkExtent3D extent;
  IVec2 renderSize;
  string local_690;
  string local_670;
  VkCommandBuffer local_650;
  undefined1 local_648 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_638;
  Surface errorMask;
  LogImageSet local_608;
  GridRenderTestInstance *local_5c8;
  deUint32 local_5bc;
  undefined1 local_5b8 [40];
  TestStatus *local_590;
  string local_588;
  string local_568;
  string local_548;
  string local_528;
  VkRenderPass local_508;
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_500;
  VkQueue local_4e8;
  VkDeviceSize local_4e0;
  ConstPixelBufferAccess imageAllLayers;
  TextureFormat local_4b0;
  RGBA color;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_498;
  _Alloc_hider local_488;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478 [6];
  VkCommandBuffer local_418;
  long *plStack_410;
  VkAccessFlags local_408;
  VkAccessFlags VStack_404;
  VkImageLayout VStack_400;
  VkImageLayout VStack_3fc;
  Image local_3f8;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  deUint32 local_3b8;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  deUint32 local_398;
  undefined8 local_388;
  undefined8 uStack_380;
  deUint32 local_378;
  VkPipeline local_368;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_360;
  VkCommandPool local_348;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_340;
  VkPipelineLayout local_328;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_320;
  VkFramebuffer local_308;
  Deleter<vk::Handle<(vk::HandleType)23>_> DStack_300;
  VkImageView local_2e8;
  Deleter<vk::Handle<(vk::HandleType)13>_> DStack_2e0;
  Buffer local_2c8;
  LogImage local_298;
  VkImageMemoryBarrier colorAttachmentLayoutBarrier;
  ios_base local_190 [132];
  deUint32 local_10c;
  bool local_108;
  VkPrimitiveTopology local_104;
  VkImageCreateInfo colorImageCreateInfo;
  
  local_590 = __return_storage_ptr__;
  vki = Context::getInstanceInterface((this->super_TestInstance).m_context);
  physDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  requireFeatures(vki,physDevice,3);
  colorAttachmentLayoutBarrier._0_8_ = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  ppvVar15 = &colorAttachmentLayoutBarrier.pNext;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar15);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)ppvVar15,
             "Rendering single point at the origin. Expecting yellow and green colored grid-like image. (High-frequency grid may appear unicolored)."
             ,0x86);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&colorAttachmentLayoutBarrier,
             (EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar15);
  std::ios_base::~ios_base(local_190);
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  local_4e8 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  local_5bc = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  allocator = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  renderSize.m_data[0] = 0x100;
  renderSize.m_data[1] = 0x100;
  numArrayLayers = (this->m_params).numLayers;
  makeImageCreateInfo(&colorImageCreateInfo,&renderSize,VK_FORMAT_R8G8B8A8_UNORM,0x11,numArrayLayers
                     );
  local_650 = (VkCommandBuffer)CONCAT71(local_650._1_7_,(this->m_params).numLayers != 1);
  Image::Image(&local_3f8,vk,device,allocator,&colorImageCreateInfo,(MemoryRequirement)0x0);
  iVar14 = renderSize.m_data[1] * renderSize.m_data[0];
  iVar5 = (this->m_params).numLayers;
  local_5c8 = this;
  TVar6 = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar4 = tcu::getPixelSize(TVar6);
  local_4e0 = (VkDeviceSize)(iVar14 * iVar5 * iVar4);
  makeBufferCreateInfo((VkBufferCreateInfo *)&colorAttachmentLayoutBarrier,local_4e0,2);
  tessellation::Buffer::Buffer
            (&local_2c8,vk,device,allocator,(VkBufferCreateInfo *)&colorAttachmentLayoutBarrier,
             (MemoryRequirement)0x1);
  local_388 = 1;
  uStack_380 = 1;
  subresourceRange.levelCount = 1;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.layerCount = numArrayLayers;
  local_378 = numArrayLayers;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&colorAttachmentLayoutBarrier,vk,device,
                (VkImage)local_3f8.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                         object.m_internal,(uint)(byte)local_650 * 4 + VK_IMAGE_VIEW_TYPE_2D,
                VK_FORMAT_R8G8B8A8_UNORM,subresourceRange);
  DStack_2e0.m_device = (VkDevice)colorAttachmentLayoutBarrier._16_8_;
  DStack_2e0.m_allocator = (VkAllocationCallbacks *)colorAttachmentLayoutBarrier._24_8_;
  local_2e8.m_internal = colorAttachmentLayoutBarrier._0_8_;
  DStack_2e0.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  makeRenderPass((Move<vk::Handle<(vk::HandleType)17>_> *)&colorAttachmentLayoutBarrier,vk,device,
                 VK_FORMAT_R8G8B8A8_UNORM);
  pGVar2 = local_5c8;
  DStack_500.m_device = (VkDevice)colorAttachmentLayoutBarrier._16_8_;
  DStack_500.m_allocator = (VkAllocationCallbacks *)colorAttachmentLayoutBarrier._24_8_;
  local_508.m_internal = colorAttachmentLayoutBarrier._0_8_;
  DStack_500.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)&colorAttachmentLayoutBarrier,vk,device,
                  (VkRenderPass)colorAttachmentLayoutBarrier._0_8_,local_2e8,renderSize.m_data[0],
                  renderSize.m_data[1],(local_5c8->m_params).numLayers);
  DStack_300.m_device = (VkDevice)colorAttachmentLayoutBarrier._16_8_;
  DStack_300.m_allocator = (VkAllocationCallbacks *)colorAttachmentLayoutBarrier._24_8_;
  local_308.m_internal = colorAttachmentLayoutBarrier._0_8_;
  DStack_300.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  makePipelineLayoutWithoutDescriptors
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&colorAttachmentLayoutBarrier,vk,device);
  DStack_320.m_device = (VkDevice)colorAttachmentLayoutBarrier._16_8_;
  DStack_320.m_allocator = (VkAllocationCallbacks *)colorAttachmentLayoutBarrier._24_8_;
  local_328.m_internal = colorAttachmentLayoutBarrier._0_8_;
  DStack_320.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&colorAttachmentLayoutBarrier,vk,device,
                  local_5bc);
  DStack_340.m_device = (VkDevice)colorAttachmentLayoutBarrier._16_8_;
  DStack_340.m_allocator = (VkAllocationCallbacks *)colorAttachmentLayoutBarrier._24_8_;
  local_348.m_internal = colorAttachmentLayoutBarrier._0_8_;
  DStack_340.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&colorAttachmentLayoutBarrier,vk,device,
             (VkCommandPool)colorAttachmentLayoutBarrier._0_8_,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_408 = colorAttachmentLayoutBarrier.srcAccessMask;
  VStack_404 = colorAttachmentLayoutBarrier.dstAccessMask;
  VStack_400 = colorAttachmentLayoutBarrier.oldLayout;
  VStack_3fc = colorAttachmentLayoutBarrier.newLayout;
  local_418 = (VkCommandBuffer)colorAttachmentLayoutBarrier._0_8_;
  plStack_410 = (long *)colorAttachmentLayoutBarrier.pNext;
  memset(&colorAttachmentLayoutBarrier.pNext,0,0xf4);
  local_10c = 1;
  local_108 = false;
  local_104 = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
  colorAttachmentLayoutBarrier.sType = renderSize.m_data[0];
  colorAttachmentLayoutBarrier._4_4_ = renderSize.m_data[1];
  p_Var1 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((pGVar2->super_TestInstance).m_context)->m_progCollection;
  local_298.m_name._M_dataplus._M_p = (pointer)&local_298.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"vert","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(p_Var1,&local_298.m_name);
  pGVar8 = GraphicsPipelineBuilder::setShader
                     ((GraphicsPipelineBuilder *)&colorAttachmentLayoutBarrier,vk,device,
                      VK_SHADER_STAGE_VERTEX_BIT,*(ProgramBinary **)(cVar7._M_node + 2),
                      (VkSpecializationInfo *)0x0);
  p_Var1 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((pGVar2->super_TestInstance).m_context)->m_progCollection;
  local_608.m_name._M_dataplus._M_p = (pointer)&local_608.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_608,"frag","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(p_Var1,&local_608.m_name);
  pGVar8 = GraphicsPipelineBuilder::setShader
                     (pGVar8,vk,device,VK_SHADER_STAGE_FRAGMENT_BIT,
                      *(ProgramBinary **)(cVar7._M_node + 2),(VkSpecializationInfo *)0x0);
  p_Var1 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((pGVar2->super_TestInstance).m_context)->m_progCollection;
  local_648._0_8_ = &local_638;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_648,"tesc","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(p_Var1,(key_type *)local_648);
  pGVar8 = GraphicsPipelineBuilder::setShader
                     (pGVar8,vk,device,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,
                      *(ProgramBinary **)(cVar7._M_node + 2),(VkSpecializationInfo *)0x0);
  p_Var1 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((pGVar2->super_TestInstance).m_context)->m_progCollection;
  TVar6 = (TextureFormat)(imageAllLayers.m_size.m_data + 2);
  imageAllLayers.m_format = TVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)&imageAllLayers,"tese","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(p_Var1,(key_type *)&imageAllLayers);
  pGVar8 = GraphicsPipelineBuilder::setShader
                     (pGVar8,vk,device,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,
                      *(ProgramBinary **)(cVar7._M_node + 2),(VkSpecializationInfo *)0x0);
  p_Var1 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((pGVar2->super_TestInstance).m_context)->m_progCollection;
  local_5b8._0_8_ = (long)local_5b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"geom","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(p_Var1,(key_type *)local_5b8);
  pGVar8 = GraphicsPipelineBuilder::setShader
                     (pGVar8,vk,device,VK_SHADER_STAGE_GEOMETRY_BIT,
                      *(ProgramBinary **)(cVar7._M_node + 2),(VkSpecializationInfo *)0x0);
  GraphicsPipelineBuilder::build
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&color,pGVar8,vk,device,local_328,local_508);
  DStack_360.m_device = (VkDevice)local_498._M_allocated_capacity;
  DStack_360.m_allocator = (VkAllocationCallbacks *)local_498._8_8_;
  local_368.m_internal = (deUint64)_color;
  _color = (pointer)0x0;
  local_498._M_allocated_capacity = 0;
  local_498._8_8_ = (VkAllocationCallbacks *)0x0;
  if (local_5b8._0_8_ != (long)local_5b8 + 0x10) {
    operator_delete((void *)local_5b8._0_8_,local_5b8._16_8_ + 1);
  }
  bufferSizeBytes = local_4e0;
  if (imageAllLayers.m_format != TVar6) {
    operator_delete((void *)imageAllLayers.m_format,imageAllLayers._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_648._0_8_ != &local_638) {
    operator_delete((void *)local_648._0_8_,local_638._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_608.m_name._M_dataplus._M_p != &local_608.m_name.field_2) {
    operator_delete(local_608.m_name._M_dataplus._M_p,
                    local_608.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298.m_name._M_dataplus._M_p != &local_298.m_name.field_2) {
    operator_delete(local_298.m_name._M_dataplus._M_p,
                    local_298.m_name.field_2._M_allocated_capacity + 1);
  }
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder
            ((GraphicsPipelineBuilder *)&colorAttachmentLayoutBarrier);
  commandBuffer = local_418;
  beginCommandBuffer(vk,local_418);
  local_3a8 = 1;
  uStack_3a0 = 1;
  subresourceRange_00.levelCount = 1;
  subresourceRange_00.baseArrayLayer = 0;
  subresourceRange_00.aspectMask = 1;
  subresourceRange_00.baseMipLevel = 0;
  subresourceRange_00.layerCount = numArrayLayers;
  local_398 = numArrayLayers;
  makeImageMemoryBarrier
            (&colorAttachmentLayoutBarrier,0,0x100,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
             (VkImage)local_3f8.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                      m_internal,subresourceRange_00);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,commandBuffer,1,0x80,0,0,0,0,0,1,(int)&colorAttachmentLayoutBarrier);
  colorAttachmentLayoutBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttachmentLayoutBarrier._4_4_ = 0;
  colorAttachmentLayoutBarrier.pNext = (void *)renderSize.m_data;
  _color = (pointer)0x0;
  beginRenderPass(vk,commandBuffer,local_508,local_308,(VkRect2D *)&colorAttachmentLayoutBarrier,
                  (Vec4 *)&color);
  (*vk->_vptr_DeviceInterface[0x4c])(vk,commandBuffer,0,local_368.m_internal);
  (*vk->_vptr_DeviceInterface[0x59])(vk,commandBuffer,1,1,0,0);
  endRenderPass(vk,commandBuffer);
  local_3c8 = 1;
  uStack_3c0 = 1;
  subresourceRange_01.levelCount = 1;
  subresourceRange_01.baseArrayLayer = 0;
  subresourceRange_01.aspectMask = 1;
  subresourceRange_01.baseMipLevel = 0;
  subresourceRange_01.layerCount = numArrayLayers;
  local_3b8 = numArrayLayers;
  makeImageMemoryBarrier
            (&colorAttachmentLayoutBarrier,0x100,0x800,VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
             VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
             (VkImage)local_3f8.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                      m_internal,subresourceRange_01);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,commandBuffer,0x400,0x1000,0,0,0,0,0,1,(int)&colorAttachmentLayoutBarrier);
  subresourceLayers._8_8_ = (ulong)(uint)(pGVar2->m_params).numLayers << 0x20;
  subresourceLayers.aspectMask = 1;
  subresourceLayers.mipLevel = 0;
  extent.depth = 1;
  extent.width = renderSize.m_data[0];
  extent.height = renderSize.m_data[1];
  makeBufferImageCopy((VkBufferImageCopy *)&colorAttachmentLayoutBarrier,extent,subresourceLayers);
  (*vk->_vptr_DeviceInterface[99])
            (vk,commandBuffer,
             local_3f8.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
             m_internal,6,
             local_2c8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,1,(int)&colorAttachmentLayoutBarrier);
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)&colorAttachmentLayoutBarrier,0x1000,0x2000,
             (VkBuffer)
             local_2c8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,bufferSizeBytes);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,commandBuffer,0x1000,0x4000,0,0,0,1,&colorAttachmentLayoutBarrier,0,0);
  endCommandBuffer(vk,commandBuffer);
  submitCommandsAndWait(vk,device,local_4e8,commandBuffer);
  pAVar3 = local_2c8.m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((local_2c8.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (local_2c8.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,bufferSizeBytes);
  colorAttachmentLayoutBarrier._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&imageAllLayers,(TextureFormat *)&colorAttachmentLayoutBarrier,renderSize.m_data[0],
             renderSize.m_data[1],(pGVar2->m_params).numLayers,pAVar3->m_hostPtr);
  iVar5 = (pGVar2->m_params).numLayers;
  if (iVar5 < 1) {
LAB_007b9abb:
    colorAttachmentLayoutBarrier._0_8_ = &colorAttachmentLayoutBarrier.srcAccessMask;
    std::__cxx11::string::_M_construct<char_const*>((string *)&colorAttachmentLayoutBarrier,"OK","")
    ;
    pTVar11 = local_590;
    local_590->m_code = QP_TEST_RESULT_PASS;
    (local_590->m_description)._M_dataplus._M_p = (pointer)&(local_590->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_590->m_description,colorAttachmentLayoutBarrier._0_8_,
               (long)colorAttachmentLayoutBarrier.pNext + colorAttachmentLayoutBarrier._0_8_);
  }
  else {
    bVar13 = true;
    iVar4 = 0;
    do {
      while (bVar13) {
        pTVar9 = ((local_5c8->super_TestInstance).m_context)->m_testCtx->m_log;
        tcu::getSubregion((ConstPixelBufferAccess *)local_5b8,&imageAllLayers,0,0,iVar4,
                          renderSize.m_data[0],renderSize.m_data[1],1);
        tcu::Surface::Surface(&errorMask,local_5b8._8_4_,local_5b8._12_4_);
        _color = (pointer)0x300000008;
        pvVar12 = (void *)errorMask.m_pixels.m_cap;
        if (errorMask.m_pixels.m_cap != 0) {
          pvVar12 = errorMask.m_pixels.m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)&colorAttachmentLayoutBarrier,(TextureFormat *)&color,
                   errorMask.m_width,errorMask.m_height,1,pvVar12);
        _color = (pointer)0x3f80000000000000;
        tcu::clear((PixelBufferAccess *)&colorAttachmentLayoutBarrier,(Vec4 *)&color);
        colorAttachmentLayoutBarrier._0_8_ = pTVar9;
        std::__cxx11::ostringstream::ostringstream
                  ((ostringstream *)&colorAttachmentLayoutBarrier.pNext);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&colorAttachmentLayoutBarrier.pNext,"Verifying output layer ",0x17);
        std::ostream::operator<<(&colorAttachmentLayoutBarrier.pNext,iVar4);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&colorAttachmentLayoutBarrier,
                   (EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream
                  ((ostringstream *)&colorAttachmentLayoutBarrier.pNext);
        std::ios_base::~ios_base(local_190);
        local_650 = commandBuffer;
        if ((int)local_5b8._12_4_ < 1) {
LAB_007b97a7:
          ppvVar15 = &colorAttachmentLayoutBarrier.pNext;
          colorAttachmentLayoutBarrier._0_8_ = pTVar9;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar15);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar15,"Image valid.",0xc)
          ;
          pTVar9 = tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)&colorAttachmentLayoutBarrier,
                              (EndMessageToken *)&tcu::TestLog::EndMessage);
          local_608.m_name._M_dataplus._M_p = (pointer)&local_608.m_name.field_2;
          _color = (pointer)0x11;
          local_608.m_name._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_608,(ulong)&color);
          local_608.m_name.field_2._M_allocated_capacity = (size_type)_color;
          *(undefined8 *)local_608.m_name._M_dataplus._M_p = 0x7265566567616d49;
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_608.m_name._M_dataplus._M_p + 8) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_608.m_name._M_dataplus._M_p + 9) = 'f';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_608.m_name._M_dataplus._M_p + 10) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_608.m_name._M_dataplus._M_p + 0xb) = 'c';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_608.m_name._M_dataplus._M_p + 0xc) = 'a';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_608.m_name._M_dataplus._M_p + 0xd) = 't';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_608.m_name._M_dataplus._M_p + 0xe) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_608.m_name._M_dataplus._M_p + 0xf) = 'o';
          local_608.m_name._M_dataplus._M_p[0x10] = 'n';
          local_608.m_name._M_string_length = (size_type)_color;
          local_608.m_name._M_dataplus._M_p[(long)_color] = '\0';
          local_648._0_8_ = &local_638;
          _color = (pointer)0x12;
          local_648._0_8_ = std::__cxx11::string::_M_create((ulong *)local_648,(ulong)&color);
          local_638._M_allocated_capacity = (size_type)_color;
          *(undefined8 *)local_648._0_8_ = 0x6576206567616d49;
          builtin_strncpy((char *)(local_648._0_8_ + 8),"rificati",8);
          *(undefined2 *)(local_648._0_8_ + 0x10) = 0x6e6f;
          local_648._8_8_ = _color;
          _color[local_648._0_8_] = '\0';
          tcu::LogImageSet::LogImageSet
                    ((LogImageSet *)&local_298,&local_608.m_name,(string *)local_648);
          tcu::TestLog::startImageSet
                    (pTVar9,local_298.m_name._M_dataplus._M_p,
                     local_298.m_description._M_dataplus._M_p);
          commandBuffer = local_650;
          local_690._M_dataplus._M_p = (pointer)&local_690.field_2;
          local_690._M_string_length = 6;
          local_690.field_2._M_allocated_capacity._0_7_ = 0x746c75736552;
          local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
          local_670.field_2._8_7_ = 0x746c7573657220;
          local_670.field_2._M_allocated_capacity._0_7_ = 0x657265646e6552;
          local_670.field_2._M_local_buf[7] = 'd';
          local_670._M_string_length = 0xf;
          local_670.field_2._M_local_buf[0xf] = '\0';
          pCVar10 = (ConstPixelBufferAccess *)local_5b8;
          tcu::LogImage::LogImage
                    ((LogImage *)&color,&local_690,&local_670,pCVar10,QP_IMAGE_COMPRESSION_MODE_BEST
                    );
          tcu::LogImage::write((LogImage *)&color,(int)pTVar9,__buf_01,(size_t)pCVar10);
          tcu::TestLog::endImageSet(pTVar9);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_488._M_p != local_478) {
            operator_delete(local_488._M_p,local_478[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_color != &local_498) {
            operator_delete(_color,(ulong)(local_498._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_670._M_dataplus._M_p != &local_670.field_2) {
            operator_delete(local_670._M_dataplus._M_p,
                            CONCAT17(local_670.field_2._M_local_buf[7],
                                     local_670.field_2._M_allocated_capacity._0_7_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_690._M_dataplus._M_p != &local_690.field_2) {
            operator_delete(local_690._M_dataplus._M_p,
                            (ulong)(local_690.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298.m_description._M_dataplus._M_p != &local_298.m_description.field_2) {
            operator_delete(local_298.m_description._M_dataplus._M_p,
                            local_298.m_description.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298.m_name._M_dataplus._M_p != &local_298.m_name.field_2) {
            operator_delete(local_298.m_name._M_dataplus._M_p,
                            local_298.m_name.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_648._0_8_ != &local_638) {
            operator_delete((void *)local_648._0_8_,local_638._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_608.m_name._M_dataplus._M_p != &local_608.m_name.field_2) {
            operator_delete(local_608.m_name._M_dataplus._M_p,
                            local_608.m_name.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar15);
          std::ios_base::~ios_base(local_190);
          bVar13 = true;
        }
        else {
          bVar13 = false;
          z = 0;
          iVar5 = local_5b8._12_4_;
          iVar14 = local_5b8._8_4_;
          do {
            if (0 < iVar14) {
              y = 0;
              do {
                tcu::ConstPixelBufferAccess::getPixel
                          ((ConstPixelBufferAccess *)&colorAttachmentLayoutBarrier,(int)local_5b8,y,
                           z);
                tcu::RGBA::RGBA(&color,(Vec4 *)&colorAttachmentLayoutBarrier);
                if ((color.m_value & 0xff00) < 0xf700 || 0x80000 < (color.m_value & 0xff0000)) {
                  *(undefined4 *)
                   ((long)errorMask.m_pixels.m_ptr + (long)(errorMask.m_width * z + y) * 4) =
                       0xff0000ff;
                  bVar13 = true;
                }
                y = y + 1;
                iVar5 = local_5b8._12_4_;
                iVar14 = local_5b8._8_4_;
              } while (y < (int)local_5b8._8_4_);
            }
            commandBuffer = local_650;
            z = z + 1;
          } while (z < iVar5);
          if (!bVar13) goto LAB_007b97a7;
          colorAttachmentLayoutBarrier._0_8_ = pTVar9;
          std::__cxx11::ostringstream::ostringstream
                    ((ostringstream *)&colorAttachmentLayoutBarrier.pNext);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&colorAttachmentLayoutBarrier.pNext,
                     "Image verification failed, found invalid pixels.",0x30);
          pTVar9 = tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)&colorAttachmentLayoutBarrier,
                              (EndMessageToken *)&tcu::TestLog::EndMessage);
          local_690._M_dataplus._M_p = (pointer)&local_690.field_2;
          _color = (pointer)0x11;
          local_690._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_690,(ulong)&color);
          local_690.field_2._M_allocated_capacity = (size_type)_color;
          *(undefined8 *)local_690._M_dataplus._M_p = 0x7265566567616d49;
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_690._M_dataplus._M_p + 8) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_690._M_dataplus._M_p + 9) = 'f';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_690._M_dataplus._M_p + 10) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_690._M_dataplus._M_p + 0xb) = 'c';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_690._M_dataplus._M_p + 0xc) = 'a';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_690._M_dataplus._M_p + 0xd) = 't';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_690._M_dataplus._M_p + 0xe) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_690._M_dataplus._M_p + 0xf) = 'o';
          local_690._M_dataplus._M_p[0x10] = 'n';
          local_690._M_string_length = (size_type)_color;
          local_690._M_dataplus._M_p[(long)_color] = '\0';
          local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
          _color = (pointer)0x12;
          local_670._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_670,(ulong)&color);
          local_670.field_2._M_allocated_capacity._0_7_ = SUB87(_color,0);
          local_670.field_2._M_local_buf[7] = (char)((ulong)_color >> 0x38);
          *(undefined8 *)local_670._M_dataplus._M_p = 0x6576206567616d49;
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_670._M_dataplus._M_p + 8) = 'r';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_670._M_dataplus._M_p + 9) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_670._M_dataplus._M_p + 10) = 'f';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_670._M_dataplus._M_p + 0xb) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_670._M_dataplus._M_p + 0xc) = 'c';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_670._M_dataplus._M_p + 0xd) = 'a';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_670._M_dataplus._M_p + 0xe) = 't';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_670._M_dataplus._M_p + 0xf) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_670._M_dataplus._M_p + 0x10) = 'o';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_670._M_dataplus._M_p + 0x11) = 'n';
          local_670._M_string_length = (size_type)_color;
          local_670._M_dataplus._M_p[(long)_color] = '\0';
          tcu::LogImageSet::LogImageSet(&local_608,&local_690,&local_670);
          tcu::TestLog::startImageSet
                    (pTVar9,local_608.m_name._M_dataplus._M_p,
                     local_608.m_description._M_dataplus._M_p);
          pCVar10 = (ConstPixelBufferAccess *)local_648;
          local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
          local_528.field_2._M_allocated_capacity._4_2_ = 0x746c;
          local_528.field_2._M_allocated_capacity._0_4_ = 0x75736552;
          local_528._M_string_length = 6;
          local_528.field_2._M_local_buf[6] = '\0';
          local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
          local_548.field_2._8_7_ = 0x746c7573657220;
          local_548.field_2._M_allocated_capacity._0_7_ = 0x657265646e6552;
          local_548.field_2._M_local_buf[7] = 'd';
          local_548._M_string_length = 0xf;
          local_548.field_2._M_local_buf[0xf] = '\0';
          access = (ConstPixelBufferAccess *)local_5b8;
          tcu::LogImage::LogImage
                    ((LogImage *)&color,&local_528,&local_548,access,QP_IMAGE_COMPRESSION_MODE_BEST)
          ;
          tcu::LogImage::write((LogImage *)&color,(int)pTVar9,__buf,(size_t)access);
          local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
          local_568.field_2._M_allocated_capacity = 0x73614d726f727245;
          local_568.field_2._M_local_buf[8] = 'k';
          local_568._M_string_length = 9;
          local_568.field_2._M_local_buf[9] = '\0';
          local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
          local_588.field_2._M_allocated_capacity = 0x616d20726f727245;
          local_588.field_2._8_2_ = 0x6b73;
          local_588._M_string_length = 10;
          local_588.field_2._M_local_buf[10] = '\0';
          local_4b0.order = RGBA;
          local_4b0.type = UNORM_INT8;
          pvVar12 = (void *)errorMask.m_pixels.m_cap;
          if (errorMask.m_pixels.m_cap != 0) {
            pvVar12 = errorMask.m_pixels.m_ptr;
          }
          tcu::PixelBufferAccess::PixelBufferAccess
                    ((PixelBufferAccess *)pCVar10,&local_4b0,errorMask.m_width,errorMask.m_height,1,
                     pvVar12);
          tcu::LogImage::LogImage
                    (&local_298,&local_568,&local_588,pCVar10,QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write(&local_298,(int)pTVar9,__buf_00,(size_t)pCVar10);
          tcu::TestLog::endImageSet(pTVar9);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298.m_description._M_dataplus._M_p != &local_298.m_description.field_2) {
            operator_delete(local_298.m_description._M_dataplus._M_p,
                            local_298.m_description.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298.m_name._M_dataplus._M_p != &local_298.m_name.field_2) {
            operator_delete(local_298.m_name._M_dataplus._M_p,
                            local_298.m_name.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_588._M_dataplus._M_p != &local_588.field_2) {
            operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_568._M_dataplus._M_p != &local_568.field_2) {
            operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_488._M_p != local_478) {
            operator_delete(local_488._M_p,local_478[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_color != &local_498) {
            operator_delete(_color,(ulong)(local_498._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_548._M_dataplus._M_p != &local_548.field_2) {
            operator_delete(local_548._M_dataplus._M_p,
                            CONCAT17(local_548.field_2._M_local_buf[7],
                                     local_548.field_2._M_allocated_capacity._0_7_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_528._M_dataplus._M_p != &local_528.field_2) {
            operator_delete(local_528._M_dataplus._M_p,
                            CONCAT17(local_528.field_2._M_local_buf[7],
                                     CONCAT16(local_528.field_2._M_local_buf[6],
                                              CONCAT24(local_528.field_2._M_allocated_capacity._4_2_
                                                       ,local_528.field_2._M_allocated_capacity.
                                                        _0_4_))) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_608.m_description._M_dataplus._M_p != &local_608.m_description.field_2) {
            operator_delete(local_608.m_description._M_dataplus._M_p,
                            local_608.m_description.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_608.m_name._M_dataplus._M_p != &local_608.m_name.field_2) {
            operator_delete(local_608.m_name._M_dataplus._M_p,
                            local_608.m_name.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_670._M_dataplus._M_p != &local_670.field_2) {
            operator_delete(local_670._M_dataplus._M_p,
                            CONCAT17(local_670.field_2._M_local_buf[7],
                                     local_670.field_2._M_allocated_capacity._0_7_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_690._M_dataplus._M_p != &local_690.field_2) {
            operator_delete(local_690._M_dataplus._M_p,
                            (ulong)(local_690.field_2._M_allocated_capacity + 1));
          }
          std::__cxx11::ostringstream::~ostringstream
                    ((ostringstream *)&colorAttachmentLayoutBarrier.pNext);
          std::ios_base::~ios_base(local_190);
          bVar13 = false;
        }
        tcu::Surface::~Surface(&errorMask);
        iVar5 = (local_5c8->m_params).numLayers;
        iVar4 = iVar4 + 1;
        if (iVar5 <= iVar4) {
          if (bVar13) goto LAB_007b9abb;
          goto LAB_007b9b16;
        }
      }
      iVar4 = iVar4 + 1;
      bVar13 = false;
    } while (iVar4 < iVar5);
LAB_007b9b16:
    colorAttachmentLayoutBarrier._0_8_ = &colorAttachmentLayoutBarrier.srcAccessMask;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&colorAttachmentLayoutBarrier,"Image comparison failed","");
    pTVar11 = local_590;
    local_590->m_code = QP_TEST_RESULT_FAIL;
    (local_590->m_description)._M_dataplus._M_p = (pointer)&(local_590->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_590->m_description,colorAttachmentLayoutBarrier._0_8_,
               (long)colorAttachmentLayoutBarrier.pNext + colorAttachmentLayoutBarrier._0_8_);
  }
  if ((VkAccessFlags *)colorAttachmentLayoutBarrier._0_8_ !=
      &colorAttachmentLayoutBarrier.srcAccessMask) {
    operator_delete((void *)colorAttachmentLayoutBarrier._0_8_,
                    colorAttachmentLayoutBarrier._16_8_ + 1);
  }
  if (local_368.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()(&DStack_360,local_368);
  }
  if (commandBuffer != (VkCommandBuffer)0x0) {
    colorAttachmentLayoutBarrier._0_8_ = commandBuffer;
    (**(code **)(*plStack_410 + 0x240))(plStack_410,_local_408,_VStack_400,1);
  }
  if (local_348.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_340,local_348);
  }
  if (local_328.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()(&DStack_320,local_328);
  }
  if (local_308.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()(&DStack_300,local_308);
  }
  if (local_508.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()(&DStack_500,local_508);
  }
  if (local_2e8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()(&DStack_2e0,local_2e8);
  }
  if (local_2c8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (*(local_2c8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr)->_vptr_Allocation[1])();
    local_2c8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (local_2c8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0
     ) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_2c8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_2c8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  if (local_3f8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (*(local_3f8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr)->_vptr_Allocation[1])();
    local_3f8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (local_3f8.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal != 0)
  {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&local_3f8.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
               (VkImage)local_3f8.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                        object.m_internal);
  }
  return pTVar11;
}

Assistant:

tcu::TestStatus GridRenderTestInstance::iterate (void)
{
	requireFeatures(m_context.getInstanceInterface(), m_context.getPhysicalDevice(), FEATURE_TESSELLATION_SHADER | FEATURE_GEOMETRY_SHADER);

	m_context.getTestContext().getLog()
		<< tcu::TestLog::Message
		<< "Rendering single point at the origin. Expecting yellow and green colored grid-like image. (High-frequency grid may appear unicolored)."
		<< tcu::TestLog::EndMessage;

	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	// Color attachment

	const tcu::IVec2			  renderSize			   = tcu::IVec2(RENDER_SIZE, RENDER_SIZE);
	const VkFormat				  colorFormat			   = VK_FORMAT_R8G8B8A8_UNORM;
	const VkImageSubresourceRange colorImageAllLayersRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, m_params.numLayers);
	const VkImageCreateInfo		  colorImageCreateInfo	   = makeImageCreateInfo(renderSize, colorFormat, VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT, m_params.numLayers);
	const VkImageViewType		  colorAttachmentViewType  = (m_params.numLayers == 1 ? VK_IMAGE_VIEW_TYPE_2D : VK_IMAGE_VIEW_TYPE_2D_ARRAY);
	const Image					  colorAttachmentImage	   (vk, device, allocator, colorImageCreateInfo, MemoryRequirement::Any);

	// Color output buffer: image will be copied here for verification (big enough for all layers).

	const VkDeviceSize	colorBufferSizeBytes	= renderSize.x()*renderSize.y() * m_params.numLayers * tcu::getPixelSize(mapVkFormat(colorFormat));
	const Buffer		colorBuffer				(vk, device, allocator, makeBufferCreateInfo(colorBufferSizeBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT), MemoryRequirement::HostVisible);

	// Pipeline: no vertex input attributes nor descriptors.

	const Unique<VkImageView>		colorAttachmentView(makeImageView						(vk, device, *colorAttachmentImage, colorAttachmentViewType, colorFormat, colorImageAllLayersRange));
	const Unique<VkRenderPass>		renderPass		   (makeRenderPass						(vk, device, colorFormat));
	const Unique<VkFramebuffer>		framebuffer		   (makeFramebuffer						(vk, device, *renderPass, *colorAttachmentView, renderSize.x(), renderSize.y(), m_params.numLayers));
	const Unique<VkPipelineLayout>	pipelineLayout	   (makePipelineLayoutWithoutDescriptors(vk, device));
	const Unique<VkCommandPool>		cmdPool			   (makeCommandPool						(vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer		   (allocateCommandBuffer				(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	const Unique<VkPipeline> pipeline (GraphicsPipelineBuilder()
		.setRenderSize	(renderSize)
		.setShader		(vk, device, VK_SHADER_STAGE_VERTEX_BIT,				  m_context.getBinaryCollection().get("vert"), DE_NULL)
		.setShader		(vk, device, VK_SHADER_STAGE_FRAGMENT_BIT,				  m_context.getBinaryCollection().get("frag"), DE_NULL)
		.setShader		(vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,	  m_context.getBinaryCollection().get("tesc"), DE_NULL)
		.setShader		(vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, m_context.getBinaryCollection().get("tese"), DE_NULL)
		.setShader		(vk, device, VK_SHADER_STAGE_GEOMETRY_BIT,				  m_context.getBinaryCollection().get("geom"), DE_NULL)
		.build			(vk, device, *pipelineLayout, *renderPass));

	beginCommandBuffer(vk, *cmdBuffer);

	// Change color attachment image layout
	{
		const VkImageMemoryBarrier colorAttachmentLayoutBarrier = makeImageMemoryBarrier(
			(VkAccessFlags)0, VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,
			VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
			*colorAttachmentImage, colorImageAllLayersRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, 0u,
			0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentLayoutBarrier);
	}

	// Begin render pass
	{
		const VkRect2D renderArea = {
			makeOffset2D(0, 0),
			makeExtent2D(renderSize.x(), renderSize.y()),
		};
		const tcu::Vec4 clearColor(0.0f, 0.0f, 0.0f, 1.0f);

		beginRenderPass(vk, *cmdBuffer, *renderPass, *framebuffer, renderArea, clearColor);
	}

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);

	vk.cmdDraw(*cmdBuffer, 1u, 1u, 0u, 0u);
	endRenderPass(vk, *cmdBuffer);

	// Copy render result to a host-visible buffer
	{
		const VkImageMemoryBarrier colorAttachmentPreCopyBarrier = makeImageMemoryBarrier(
			VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT,
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
			*colorAttachmentImage, colorImageAllLayersRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
			0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentPreCopyBarrier);
	}
	{
		const VkImageSubresourceLayers subresourceLayers = makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, m_params.numLayers);
		const VkBufferImageCopy		   copyRegion		 = makeBufferImageCopy(makeExtent3D(renderSize.x(), renderSize.y(), 1), subresourceLayers);
		vk.cmdCopyImageToBuffer(*cmdBuffer, *colorAttachmentImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *colorBuffer, 1u, &copyRegion);
	}
	{
		const VkBufferMemoryBarrier postCopyBarrier = makeBufferMemoryBarrier(
			VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *colorBuffer, 0ull, colorBufferSizeBytes);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
			0u, DE_NULL, 1u, &postCopyBarrier, 0u, DE_NULL);
	}

	endCommandBuffer(vk, *cmdBuffer);
	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	// Verify results
	{
		const Allocation& alloc = colorBuffer.getAllocation();
		invalidateMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), colorBufferSizeBytes);

		const tcu::ConstPixelBufferAccess imageAllLayers(mapVkFormat(colorFormat), renderSize.x(), renderSize.y(), m_params.numLayers, alloc.getHostPtr());

		bool allOk = true;
		for (int ndx = 0; ndx < m_params.numLayers; ++ndx)
			allOk = allOk && verifyResultLayer(m_context.getTestContext().getLog(),
											   tcu::getSubregion(imageAllLayers, 0, 0, ndx, renderSize.x(), renderSize.y(), 1),
											   ndx);

		return (allOk ? tcu::TestStatus::pass("OK") : tcu::TestStatus::fail("Image comparison failed"));
	}
}